

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O1

int __thiscall zmq::v2_decoder_t::eight_byte_size_ready(v2_decoder_t *this,uchar *read_from_)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = *(ulong *)this->_tmpbuf;
  iVar2 = size_ready(this,uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                          (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                          (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38,read_from_);
  return iVar2;
}

Assistant:

inline uint64_t get_uint64 (const unsigned char *buffer_)
{
    return ((static_cast<uint64_t> (buffer_[0])) << 56)
           | ((static_cast<uint64_t> (buffer_[1])) << 48)
           | ((static_cast<uint64_t> (buffer_[2])) << 40)
           | ((static_cast<uint64_t> (buffer_[3])) << 32)
           | ((static_cast<uint64_t> (buffer_[4])) << 24)
           | ((static_cast<uint64_t> (buffer_[5])) << 16)
           | ((static_cast<uint64_t> (buffer_[6])) << 8)
           | (static_cast<uint64_t> (buffer_[7]));
}